

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall obs::safe_list<obs::slot<int_()>_>::iterator::~iterator(iterator *this)

{
  pthread_mutex_t *__mutex;
  
  if (this->m_node != (node *)0x0) {
    __mutex = (pthread_mutex_t *)this->m_list;
    std::mutex::lock((mutex *)&__mutex->__data);
    unlock(this);
    pthread_mutex_unlock(__mutex);
  }
  if (this->m_locked != true) {
    unref(this->m_list);
    return;
  }
  __assert_fail("!m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xb3,
                "obs::safe_list<obs::slot<int ()>>::iterator::~iterator() [T = obs::slot<int ()>]");
}

Assistant:

~iterator() {
      if (m_node) {
        std::lock_guard<std::mutex> l(m_list.m_mutex_nodes);
        unlock();
      }

      assert(!m_locked);
      m_list.unref();
    }